

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

void dg::vr::RelationsAnalyzer::inferFromPreds
               (VRLocation *location,Handle lt,Relations known,Handle rt)

{
  bool bVar1;
  VRLocation *pVVar2;
  size_t sVar3;
  const_iterator rels;
  const_iterator this;
  reference ppVVar4;
  unsigned_long *rt_00;
  VRLocation *in_RDX;
  long in_RDI;
  Relations related_3;
  size_t rtId_1;
  Relations related_2;
  Value *rtVal_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  VectorSet<const_llvm::Value_*> *__range3_1;
  size_t ltId;
  Relations related_1;
  size_t rtId;
  Relations related;
  Value *rtVal;
  const_iterator __end3;
  const_iterator __begin3;
  VectorSet<const_llvm::Value_*> *__range3;
  Value *ltVal;
  const_iterator __end2;
  const_iterator __begin2;
  VectorSet<const_llvm::Value_*> *__range2;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  setEqual;
  ValueRelations *newGraph;
  ValueRelations *predGraph;
  undefined4 in_stack_fffffffffffffe98;
  Type in_stack_fffffffffffffe9c;
  ValueRelations *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  ValueRelations *in_stack_fffffffffffffeb0;
  Value **in_stack_fffffffffffffeb8;
  VRLocation *in_stack_fffffffffffffec0;
  _Base_bitset<1UL> in_stack_fffffffffffffec8;
  VRLocation *in_stack_fffffffffffffed0;
  _Base_bitset<1UL> in_stack_fffffffffffffed8;
  _Base_bitset<1UL> _Var5;
  Value *in_stack_fffffffffffffee0;
  ValueRelations *in_stack_fffffffffffffee8;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  in_stack_fffffffffffffef0;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_a0;
  VectorSet<const_llvm::Value_*> *local_98;
  _Self local_90;
  _Self local_88;
  Value *local_80;
  Value **local_78;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_70;
  VectorSet<const_llvm::Value_*> *local_68;
  long local_30;
  ValueRelations *local_28;
  long local_10;
  VRLocation *local_8;
  
  local_10 = in_RDI;
  local_8 = in_RDX;
  pVVar2 = VRLocation::getTreePredecessor(in_stack_fffffffffffffec0);
  local_28 = &pVVar2->relations;
  local_30 = local_10 + 8;
  std::
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>::
  set((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
       *)0x1d02b1);
  local_68 = ValueRelations::getEqual
                       (in_stack_fffffffffffffeb0,
                        (Handle)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_70._M_current =
       (Value **)
       VectorSet<const_llvm::Value_*>::begin
                 ((VectorSet<const_llvm::Value_*> *)
                  CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_78 = (Value **)
             VectorSet<const_llvm::Value_*>::end
                       ((VectorSet<const_llvm::Value_*> *)
                        CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                             *)in_stack_fffffffffffffea0,
                            (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)), bVar1
        ) {
    ppVVar4 = __gnu_cxx::
              __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
              ::operator*(&local_70);
    local_80 = *ppVVar4;
    local_88._M_node =
         (_Base_ptr)
         std::
         set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
         ::find((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                (key_type *)in_stack_fffffffffffffea0);
    local_90._M_node =
         (_Base_ptr)
         std::
         set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
         ::end((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    bVar1 = std::operator!=(&local_88,&local_90);
    if (!bVar1) {
      local_98 = ValueRelations::getEqual
                           (in_stack_fffffffffffffeb0,
                            (Handle)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      local_a0._M_current =
           (Value **)
           VectorSet<const_llvm::Value_*>::begin
                     ((VectorSet<const_llvm::Value_*> *)
                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      VectorSet<const_llvm::Value_*>::end
                ((VectorSet<const_llvm::Value_*> *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                 *)in_stack_fffffffffffffea0,
                                (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
            bVar1) {
        ppVVar4 = __gnu_cxx::
                  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                  ::operator*(&local_a0);
        if (local_80 != *ppVVar4) {
          getCommon<llvm::Value_const*,llvm::Value_const*>
                    (in_stack_fffffffffffffed0,(Value **)in_stack_fffffffffffffec8._M_w,
                     (Relations)in_stack_fffffffffffffed8._M_w,(Value **)in_stack_fffffffffffffec0);
          bVar1 = Relations::any((Relations *)0x1d045e);
          if (bVar1) {
            bVar1 = Relations::has((Relations *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c)
            ;
            if (bVar1) {
              std::
              set<llvm::Value_const*,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
              ::emplace<llvm::Value_const*&>
                        ((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                          *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            }
            ValueRelations::set<llvm::Value_const*,llvm::Value_const*>
                      (in_stack_fffffffffffffee8,(Value **)in_stack_fffffffffffffee0,
                       (Relations)in_stack_fffffffffffffef0._M_current,
                       (Value **)in_stack_fffffffffffffed8._M_w);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
        ::operator++(&local_a0);
      }
      sVar3 = ValueRelations::getBorderId
                        (in_stack_fffffffffffffea0,
                         (Handle)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      if (sVar3 != 0xffffffffffffffff) {
        getCommon<llvm::Value_const*,unsigned_long>
                  (in_stack_fffffffffffffed0,(Value **)in_stack_fffffffffffffec8._M_w,
                   (Relations)in_stack_fffffffffffffed8._M_w,
                   (unsigned_long *)in_stack_fffffffffffffec0);
        bVar1 = Relations::any((Relations *)0x1d0550);
        if (bVar1) {
          ValueRelations::set<llvm::Value_const*,unsigned_long>
                    (in_stack_fffffffffffffee8,(Value **)in_stack_fffffffffffffee0,
                     (Relations)in_stack_fffffffffffffef0._M_current,
                     (unsigned_long *)in_stack_fffffffffffffed8._M_w);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator++(&local_70);
  }
  sVar3 = ValueRelations::getBorderId
                    (in_stack_fffffffffffffea0,
                     (Handle)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (sVar3 != 0xffffffffffffffff) {
    ValueRelations::getEqual
              (in_stack_fffffffffffffeb0,
               (Handle)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    rels = VectorSet<const_llvm::Value_*>::begin
                     ((VectorSet<const_llvm::Value_*> *)
                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    this = VectorSet<const_llvm::Value_*>::end
                     ((VectorSet<const_llvm::Value_*> *)
                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)in_stack_fffffffffffffea0,
                              (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
          bVar1) {
      ppVVar4 = __gnu_cxx::
                __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                ::operator*((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                             *)&stack0xfffffffffffffef0);
      in_stack_fffffffffffffee0 = *ppVVar4;
      in_stack_fffffffffffffed0 = local_8;
      in_stack_fffffffffffffed8._M_w =
           (_WordT)getCommon<unsigned_long,llvm::Value_const*>
                             (local_8,in_stack_fffffffffffffec8._M_w,in_stack_fffffffffffffed8._M_w,
                              (Value **)in_stack_fffffffffffffec0);
      bVar1 = Relations::any((Relations *)0x1d0659);
      if (bVar1) {
        _Var5._M_w = in_stack_fffffffffffffed8._M_w;
        ValueRelations::set<unsigned_long,llvm::Value_const*>
                  ((ValueRelations *)this._M_current,(unsigned_long *)in_stack_fffffffffffffee0,
                   (Relations)rels._M_current,(Value **)in_stack_fffffffffffffed8._M_w);
        in_stack_fffffffffffffec8._M_w = in_stack_fffffffffffffed8._M_w;
        in_stack_fffffffffffffed8._M_w = _Var5._M_w;
      }
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator++((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                    *)&stack0xfffffffffffffef0);
    }
    rt_00 = (unsigned_long *)
            ValueRelations::getBorderId
                      (in_stack_fffffffffffffea0,
                       (Handle)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if (rt_00 != (unsigned_long *)0xffffffffffffffff) {
      getCommon<unsigned_long,unsigned_long>
                (in_stack_fffffffffffffed0,(unsigned_long *)in_stack_fffffffffffffec8._M_w,
                 (Relations)in_stack_fffffffffffffed8._M_w,rt_00);
      bVar1 = Relations::any((Relations *)0x1d06ee);
      if (bVar1) {
        ValueRelations::set<unsigned_long,unsigned_long>
                  ((ValueRelations *)this._M_current,(unsigned_long *)in_stack_fffffffffffffee0,
                   (Relations)rels._M_current,(unsigned_long *)in_stack_fffffffffffffed8._M_w);
      }
    }
  }
  std::
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>::
  ~set((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
        *)0x1d0739);
  return;
}

Assistant:

void RelationsAnalyzer::inferFromPreds(VRLocation &location, Handle lt,
                                       Relations known, Handle rt) {
    const ValueRelations &predGraph = location.getTreePredecessor().relations;
    ValueRelations &newGraph = location.relations;

    std::set<V> setEqual;
    for (const auto *ltVal : predGraph.getEqual(lt)) {
        if (setEqual.find(ltVal) != setEqual.end())
            continue;
        for (const auto *rtVal : predGraph.getEqual(rt)) {
            if (ltVal == rtVal)
                continue;

            Relations related = getCommon(location, ltVal, known, rtVal);
            if (!related.any())
                continue;

            if (related.has(Relations::EQ))
                setEqual.emplace(rtVal);
            newGraph.set(ltVal, related, rtVal);
        }

        size_t rtId = predGraph.getBorderId(rt);
        if (rtId != std::string::npos) {
            Relations related = getCommon(location, ltVal, known, rtId);
            if (!related.any())
                continue;

            newGraph.set(ltVal, related, rtId);
        }
    }

    size_t ltId = predGraph.getBorderId(lt);
    if (ltId != std::string::npos) {
        for (const auto *rtVal : predGraph.getEqual(rt)) {
            Relations related = getCommon(location, ltId, known, rtVal);
            if (!related.any())
                continue;

            newGraph.set(ltId, related, rtVal);
        }

        size_t rtId = predGraph.getBorderId(rt);
        if (rtId != std::string::npos) {
            Relations related = getCommon(location, ltId, known, rtId);
            if (!related.any())
                return;

            newGraph.set(ltId, related, rtId);
        }
    }
}